

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O2

OPJ_BOOL opj_tls_set(opj_tls_t *tls,int key,void *value,opj_tls_free_func opj_free_func)

{
  uint uVar1;
  int iVar2;
  code *pcVar3;
  long lVar4;
  opj_tls_key_val_t *poVar5;
  long lVar6;
  ulong uVar7;
  
  uVar1 = tls->key_val_count;
  if ((long)(int)uVar1 == 0x7fffffff) {
    return 0;
  }
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  poVar5 = tls->key_val;
  lVar4 = 0;
  do {
    lVar6 = lVar4;
    if (uVar7 * 0x18 + 0x18 == lVar6 + 0x18) {
      poVar5 = (opj_tls_key_val_t *)opj_realloc(poVar5,(long)(int)uVar1 * 0x18 + 0x18);
      if (poVar5 != (opj_tls_key_val_t *)0x0) {
        tls->key_val = poVar5;
        iVar2 = tls->key_val_count;
        poVar5[iVar2].key = key;
        poVar5[iVar2].value = value;
        poVar5[iVar2].opj_free_func = opj_free_func;
        tls->key_val_count = iVar2 + 1;
        return 1;
      }
      return 0;
    }
    lVar4 = lVar6 + 0x18;
  } while (*(int *)((long)&poVar5->key + lVar6) != key);
  pcVar3 = *(code **)((long)&poVar5->opj_free_func + lVar6);
  if (pcVar3 != (code *)0x0) {
    (*pcVar3)(*(undefined8 *)((long)&poVar5->value + lVar6));
    poVar5 = tls->key_val;
  }
  *(void **)((long)&poVar5->value + lVar6) = value;
  *(opj_tls_free_func *)((long)&poVar5->opj_free_func + lVar6) = opj_free_func;
  return 1;
}

Assistant:

OPJ_BOOL opj_tls_set(opj_tls_t* tls, int key, void* value,
                     opj_tls_free_func opj_free_func)
{
    opj_tls_key_val_t* new_key_val;
    int i;

    if (tls->key_val_count == INT_MAX) {
        return OPJ_FALSE;
    }
    for (i = 0; i < tls->key_val_count; i++) {
        if (tls->key_val[i].key == key) {
            if (tls->key_val[i].opj_free_func) {
                tls->key_val[i].opj_free_func(tls->key_val[i].value);
            }
            tls->key_val[i].value = value;
            tls->key_val[i].opj_free_func = opj_free_func;
            return OPJ_TRUE;
        }
    }
    new_key_val = (opj_tls_key_val_t*) opj_realloc(tls->key_val,
                  ((size_t)tls->key_val_count + 1U) * sizeof(opj_tls_key_val_t));
    if (!new_key_val) {
        return OPJ_FALSE;
    }
    tls->key_val = new_key_val;
    new_key_val[tls->key_val_count].key = key;
    new_key_val[tls->key_val_count].value = value;
    new_key_val[tls->key_val_count].opj_free_func = opj_free_func;
    tls->key_val_count ++;
    return OPJ_TRUE;
}